

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Music_Emu.cpp
# Opt level: O0

void __thiscall Music_Emu::unload(Music_Emu *this)

{
  Gme_File *in_RDI;
  
  *(undefined4 *)&in_RDI[1].playlist.info_.composer = 0;
  clear_track_vars((Music_Emu *)0x955e12);
  Gme_File::unload(in_RDI);
  return;
}

Assistant:

void Music_Emu::unload()
{
	voice_count_ = 0;
	clear_track_vars();
	Gme_File::unload();
}